

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::rule::
replace_top<pstore::exchange::import_ns::strings_array_members,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping*>>
          (rule *this,transaction<pstore::lock_guard<pstore::transaction_mutex>_> *args,
          not_null<pstore::exchange::import_ns::string_mapping_*> args_1)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
  *this_00;
  __single_object p;
  __uniq_ptr_impl<pstore::exchange::import_ns::strings_array_members,_std::default_delete<pstore::exchange::import_ns::strings_array_members>_>
  local_28;
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> *args_local;
  not_null<pstore::exchange::import_ns::string_mapping_*> args_local_1;
  
  args_local = args;
  args_local_1 = args_1;
  std::
  make_unique<pstore::exchange::import_ns::strings_array_members,pstore::gsl::not_null<pstore::exchange::import_ns::context*>const&,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*&,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping*>&>
            ((not_null<pstore::exchange::import_ns::context_*> *)&p,
             (transaction<pstore::lock_guard<pstore::transaction_mutex>_> **)&this->context_,
             (not_null<pstore::exchange::import_ns::string_mapping_*> *)&args_local);
  log_top(this,false);
  this_00 = &((this->context_).ptr_)->stack;
  std::
  deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
  ::pop_back(&this_00->c);
  local_28._M_t.
  super__Tuple_impl<0UL,_pstore::exchange::import_ns::strings_array_members_*,_std::default_delete<pstore::exchange::import_ns::strings_array_members>_>
  .super__Head_base<0UL,_pstore::exchange::import_ns::strings_array_members_*,_false>._M_head_impl =
       (tuple<pstore::exchange::import_ns::strings_array_members_*,_std::default_delete<pstore::exchange::import_ns::strings_array_members>_>
        )(tuple<pstore::exchange::import_ns::strings_array_members_*,_std::default_delete<pstore::exchange::import_ns::strings_array_members>_>
          )p;
  p._M_t.
  super___uniq_ptr_impl<pstore::exchange::import_ns::strings_array_members,_std::default_delete<pstore::exchange::import_ns::strings_array_members>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::exchange::import_ns::strings_array_members_*,_std::default_delete<pstore::exchange::import_ns::strings_array_members>_>
  .super__Head_base<0UL,_pstore::exchange::import_ns::strings_array_members_*,_false>._M_head_impl =
       (__uniq_ptr_data<pstore::exchange::import_ns::strings_array_members,_std::default_delete<pstore::exchange::import_ns::strings_array_members>,_true,_true>
        )(__uniq_ptr_impl<pstore::exchange::import_ns::strings_array_members,_std::default_delete<pstore::exchange::import_ns::strings_array_members>_>
          )0x0;
  std::
  deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
  ::
  emplace_back<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
            ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
              *)this_00,
             (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
              *)&local_28);
  if ((_Tuple_impl<0UL,_pstore::exchange::import_ns::strings_array_members_*,_std::default_delete<pstore::exchange::import_ns::strings_array_members>_>
       )local_28._M_t.
        super__Tuple_impl<0UL,_pstore::exchange::import_ns::strings_array_members_*,_std::default_delete<pstore::exchange::import_ns::strings_array_members>_>
        .super__Head_base<0UL,_pstore::exchange::import_ns::strings_array_members_*,_false>.
        _M_head_impl != (strings_array_members *)0x0) {
    (**(code **)(*(long *)local_28._M_t.
                          super__Tuple_impl<0UL,_pstore::exchange::import_ns::strings_array_members_*,_std::default_delete<pstore::exchange::import_ns::strings_array_members>_>
                          .
                          super__Head_base<0UL,_pstore::exchange::import_ns::strings_array_members_*,_false>
                          ._M_head_impl + 8))();
  }
  log_top(this,true);
  uVar2 = std::_V2::system_category();
  std::
  unique_ptr<pstore::exchange::import_ns::strings_array_members,_std::default_delete<pstore::exchange::import_ns::strings_array_members>_>
  ::~unique_ptr(&p);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  return (error_code)(auVar1 << 0x40);
}

Assistant:

std::error_code replace_top (Args... args) {
                    auto p = std::make_unique<T> (context_, args...);
                    this->log_top (false);
                    // Remember the context pointer before we destroy 'this'.
                    auto * const context = this->get_context ();
                    context->stack.pop (); // Destroys this object.
                    context->stack.push (std::move (p));
                    this->log_top (true);
                    return {};
                }